

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu510.c
# Opt level: O0

MPP_RET hal_h264e_vepu510_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  uint uVar2;
  long lVar3;
  RK_U32 mbs;
  RK_U32 mb_h;
  RK_U32 mb_w;
  Vepu510Status *reg_st;
  Vepu510H264Fbk *fb;
  EncRcTaskInfo *rc_info;
  HalVepu510RegSet *regs;
  HalH264eVepu510Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar3 = *(long *)((long)hal + 0x140) + (long)(task->flags).reg_idx * 0xe90;
  pEVar1 = task->rc_task;
  uVar2 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c) *
          *(int *)(*(long *)((long)hal + 0x60) + 0x40);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","enter %p\n","hal_h264e_vepu510_ret_task",hal);
  }
  *(uint *)((long)hal + 0x2c8) = uVar2;
  *(uint *)((long)hal + 0x2d0) = (*(uint *)(lVar3 + 0xab0) & 0xff) << 2;
  *(uint *)((long)hal + 0x2d4) = (*(uint *)(lVar3 + 0xab0) >> 8 & 0xff) << 2;
  *(uint *)((long)hal + 0x2d8) = (*(uint *)(lVar3 + 0xab0) >> 0x10 & 0xff) << 2;
  *(uint *)((long)hal + 0x2dc) = (*(uint *)(lVar3 + 0xab0) >> 0x18) << 2;
  *(int *)((long)hal + 0x2e0) =
       *(int *)((long)hal + 0x2d0) + *(int *)((long)hal + 0x2d4) + *(int *)((long)hal + 0x2d8) +
       *(int *)((long)hal + 0x2dc);
  *(undefined4 *)((long)hal + 0x1b4) = *(undefined4 *)(*(long *)((long)hal + 0x188) + 0x2c);
  task->length = task->hw_length + task->length;
  (pEVar1->info).bit_real = task->hw_length << 3;
  (pEVar1->info).quality_real = *(uint *)(lVar3 + 0xa18) / uVar2;
  (pEVar1->info).iblk4_prop =
       (((*(uint *)(lVar3 + 0xaa8) & 0x7fffff) + (*(uint *)(lVar3 + 0xaa4) & 0x7fffff) +
        (*(uint *)(lVar3 + 0xaa0) & 0x1fffff)) * 0x100) / uVar2;
  (pEVar1->info).sse =
       (ulong)*(uint *)(lVar3 + 0xa14) * 0x10000 + (long)(int)(*(uint *)(lVar3 + 0xa10) >> 0x10);
  (pEVar1->info).lvl16_inter_num = *(uint *)(lVar3 + 0xa94) & 0x1fffff;
  (pEVar1->info).lvl8_inter_num = *(uint *)(lVar3 + 0xa98) & 0x7fffff;
  (pEVar1->info).lvl16_intra_num = *(uint *)(lVar3 + 0xaa0) & 0x1fffff;
  (pEVar1->info).lvl8_intra_num = *(uint *)(lVar3 + 0xaa4) & 0x7fffff;
  (pEVar1->info).lvl4_intra_num = *(uint *)(lVar3 + 0xaa8) & 0x7fffff;
  *(RK_S32 *)((long)hal + 0xb0) = (pEVar1->info).bit_real;
  *(RK_S32 *)((long)hal + 0xb4) = (pEVar1->info).quality_real;
  *(RK_U32 *)((long)hal + 0xc0) = (pEVar1->info).iblk4_prop;
  (task->hal_ret).data = (void *)((long)hal + 0x90);
  (task->hal_ret).number = 1;
  mpp_dev_multi_offset_reset(*(MppDevRegOffCfgs **)((long)hal + 0x38));
  if (*(long *)((long)hal + 0x70) != 0) {
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).curr_idx);
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).refr_idx);
  }
  vepu510_h264e_tune_stat_update(*(void **)((long)hal + 0x420),task);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","leave %p\n","hal_h264e_vepu510_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu510_ret_task(void * hal, HalEncTask * task)
{
    HalH264eVepu510Ctx *ctx = (HalH264eVepu510Ctx *)hal;
    HalVepu510RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    Vepu510H264Fbk *fb = &ctx->feedback;
    Vepu510Status *reg_st = &regs->reg_st;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    fb->st_mb_num = mbs;
    fb->st_smear_cnt[0] = reg_st->st_smear_cnt.rdo_smear_cnt0 * 4;
    fb->st_smear_cnt[1] = reg_st->st_smear_cnt.rdo_smear_cnt1 * 4;
    fb->st_smear_cnt[2] = reg_st->st_smear_cnt.rdo_smear_cnt2 * 4;
    fb->st_smear_cnt[3] = reg_st->st_smear_cnt.rdo_smear_cnt3 * 4;
    fb->st_smear_cnt[4] = fb->st_smear_cnt[0] + fb->st_smear_cnt[1] +
                          fb->st_smear_cnt[2] + fb->st_smear_cnt[3];
    fb->frame_type = ctx->slice->slice_type;

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs->reg_st.qp_sum / mbs;
    rc_info->iblk4_prop = (regs->reg_st.st_pnum_i4.pnum_i4 +
                           regs->reg_st.st_pnum_i8.pnum_i8 +
                           regs->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs->reg_st.sse_h32 << 16) +
                   (regs->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    mpp_dev_multi_offset_reset(ctx->offsets);

    if (ctx->dpb) {
        h264e_dpb_hal_end(ctx->dpb, task->flags.curr_idx);
        h264e_dpb_hal_end(ctx->dpb, task->flags.refr_idx);
    }

    vepu510_h264e_tune_stat_update(ctx->tune, task);

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}